

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void plus_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  uint uVar1;
  Elem **ppEVar2;
  Rule *pRVar3;
  Rule **ppRVar4;
  Elem **ppEVar5;
  int iVar6;
  Production *pPVar7;
  Rule *pRVar8;
  Elem *pEVar9;
  Elem *pEVar10;
  undefined8 *puVar11;
  AssocKind AVar12;
  Rule **ppRVar13;
  anon_struct_40_4_d8687ec6_for_elems *paVar14;
  
  pPVar7 = new_internal_production(g,g->p);
  pPVar7->field_0x3c = pPVar7->field_0x3c & 0xe3 | 0x10;
  pRVar8 = (Rule *)malloc(0xa8);
  memset(pRVar8,0,0xa8);
  pRVar8->prod = pPVar7;
  pEVar9 = (Elem *)malloc(0x20);
  pEVar9->kind = ELEM_NTERM;
  pEVar9->index = 0;
  pEVar9->rule = (Rule *)0x0;
  (pEVar9->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar9->e + 8) = 0;
  pRVar8->end = pEVar9;
  pEVar9->kind = ELEM_END;
  pEVar9->rule = pRVar8;
  pRVar8->action_index = g->action_index;
  paVar14 = &pRVar8->elems;
  pEVar9 = (g->r->elems).v[(g->r->elems).n - 1];
  ppEVar2 = (pRVar8->elems).v;
  if (g->right_recursive_BNF == 0) {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar10 = (Elem *)malloc(0x20);
      (pEVar10->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar10->e + 8) = 0;
      pEVar10->kind = ELEM_NTERM;
      pEVar10->index = 0;
      pEVar10->rule = (Rule *)0x0;
      (pEVar10->e).nterm = pPVar7;
      pEVar10->rule = pRVar8;
      (pRVar8->elems).v = (pRVar8->elems).e;
      uVar1 = (pRVar8->elems).n;
      (pRVar8->elems).n = uVar1 + 1;
      (pRVar8->elems).e[uVar1] = pEVar10;
    }
    else {
      uVar1 = (pRVar8->elems).n;
      if (ppEVar2 == (pRVar8->elems).e) {
        if (uVar1 < 3) {
          pEVar10 = (Elem *)malloc(0x20);
          (pEVar10->e).nterm = (Production *)0x0;
          *(undefined8 *)((long)&pEVar10->e + 8) = 0;
          pEVar10->kind = ELEM_NTERM;
          pEVar10->index = 0;
          pEVar10->rule = (Rule *)0x0;
          (pEVar10->e).nterm = pPVar7;
          pEVar10->rule = pRVar8;
          goto LAB_0013c1fe;
        }
      }
      else if ((uVar1 & 7) != 0) {
        pEVar10 = (Elem *)malloc(0x20);
        (pEVar10->e).nterm = (Production *)0x0;
        *(undefined8 *)((long)&pEVar10->e + 8) = 0;
        pEVar10->kind = ELEM_NTERM;
        pEVar10->index = 0;
        pEVar10->rule = (Rule *)0x0;
        (pEVar10->e).nterm = pPVar7;
        pEVar10->rule = pRVar8;
LAB_0013c1fe:
        (pRVar8->elems).n = uVar1 + 1;
        ppEVar2[uVar1] = pEVar10;
        goto LAB_0013c238;
      }
      puVar11 = (undefined8 *)malloc(0x20);
      puVar11[2] = 0;
      puVar11[3] = 0;
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11[2] = pPVar7;
      puVar11[1] = pRVar8;
      vec_add_internal(paVar14,puVar11);
    }
LAB_0013c238:
    ppEVar2 = (pRVar8->elems).v;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar10 = dup_elem(pEVar9,pRVar8);
      (pRVar8->elems).v = (pRVar8->elems).e;
      uVar1 = (pRVar8->elems).n;
      (pRVar8->elems).n = uVar1 + 1;
      (pRVar8->elems).e[uVar1] = pEVar10;
    }
    else {
      uVar1 = (pRVar8->elems).n;
      if (ppEVar2 == (pRVar8->elems).e) {
        if (2 < uVar1) goto LAB_0013c2ab;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013c2ab:
        pEVar10 = dup_elem(pEVar9,pRVar8);
        vec_add_internal(paVar14,pEVar10);
        goto LAB_0013c2c3;
      }
      pEVar10 = dup_elem(pEVar9,pRVar8);
      uVar1 = (pRVar8->elems).n;
      (pRVar8->elems).n = uVar1 + 1;
      (pRVar8->elems).v[uVar1] = pEVar10;
    }
LAB_0013c2c3:
    pRVar3 = g->r;
    pEVar10 = (Elem *)malloc(0x20);
    (pEVar10->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar10->e + 8) = 0;
    pEVar10->kind = ELEM_NTERM;
    pEVar10->index = 0;
    pEVar10->rule = (Rule *)0x0;
    (pEVar10->e).nterm = pPVar7;
    pEVar10->rule = pRVar3;
    (pRVar3->elems).v[(pRVar3->elems).n - 1] = pEVar10;
    iVar6 = g->r->rule_priority;
    AVar12 = ASSOC_NARY_LEFT;
  }
  else {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar10 = dup_elem(pEVar9,pRVar8);
      (pRVar8->elems).v = (pRVar8->elems).e;
      uVar1 = (pRVar8->elems).n;
      (pRVar8->elems).n = uVar1 + 1;
      (pRVar8->elems).e[uVar1] = pEVar10;
    }
    else {
      uVar1 = (pRVar8->elems).n;
      if (ppEVar2 == (pRVar8->elems).e) {
        if (2 < uVar1) goto LAB_0013c061;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013c061:
        pEVar10 = dup_elem(pEVar9,pRVar8);
        vec_add_internal(paVar14,pEVar10);
        goto LAB_0013c079;
      }
      pEVar10 = dup_elem(pEVar9,pRVar8);
      uVar1 = (pRVar8->elems).n;
      (pRVar8->elems).n = uVar1 + 1;
      (pRVar8->elems).v[uVar1] = pEVar10;
    }
LAB_0013c079:
    pRVar3 = g->r;
    pEVar10 = (Elem *)malloc(0x20);
    (pEVar10->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar10->e + 8) = 0;
    pEVar10->kind = ELEM_NTERM;
    pEVar10->index = 0;
    pEVar10->rule = (Rule *)0x0;
    (pEVar10->e).nterm = pPVar7;
    pEVar10->rule = pRVar3;
    (pRVar3->elems).v[(pRVar3->elems).n - 1] = pEVar10;
    ppEVar2 = (pRVar8->elems).v;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar10 = (Elem *)malloc(0x20);
      (pEVar10->e).nterm = (Production *)0x0;
      *(undefined8 *)((long)&pEVar10->e + 8) = 0;
      pEVar10->kind = ELEM_NTERM;
      pEVar10->index = 0;
      pEVar10->rule = (Rule *)0x0;
      (pEVar10->e).nterm = pPVar7;
      pEVar10->rule = pRVar8;
      (pRVar8->elems).v = (pRVar8->elems).e;
      uVar1 = (pRVar8->elems).n;
      (pRVar8->elems).n = uVar1 + 1;
      (pRVar8->elems).e[uVar1] = pEVar10;
    }
    else {
      uVar1 = (pRVar8->elems).n;
      if (ppEVar2 == (pRVar8->elems).e) {
        if (2 < uVar1) goto LAB_0013c160;
        pEVar10 = (Elem *)malloc(0x20);
        (pEVar10->e).nterm = (Production *)0x0;
        *(undefined8 *)((long)&pEVar10->e + 8) = 0;
        pEVar10->kind = ELEM_NTERM;
        pEVar10->index = 0;
        pEVar10->rule = (Rule *)0x0;
        (pEVar10->e).nterm = pPVar7;
        pEVar10->rule = pRVar8;
      }
      else {
        if ((uVar1 & 7) == 0) {
LAB_0013c160:
          puVar11 = (undefined8 *)malloc(0x20);
          puVar11[2] = 0;
          puVar11[3] = 0;
          *puVar11 = 0;
          puVar11[1] = 0;
          puVar11[2] = pPVar7;
          puVar11[1] = pRVar8;
          vec_add_internal(paVar14,puVar11);
          goto LAB_0013c189;
        }
        pEVar10 = (Elem *)malloc(0x20);
        (pEVar10->e).nterm = (Production *)0x0;
        *(undefined8 *)((long)&pEVar10->e + 8) = 0;
        pEVar10->kind = ELEM_NTERM;
        pEVar10->index = 0;
        pEVar10->rule = (Rule *)0x0;
        (pEVar10->e).nterm = pPVar7;
        pEVar10->rule = pRVar8;
      }
      (pRVar8->elems).n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar10;
    }
LAB_0013c189:
    iVar6 = g->r->rule_priority;
    AVar12 = ASSOC_NARY_RIGHT;
  }
  if (iVar6 != 0) {
    pRVar8->rule_priority = iVar6;
    pRVar8->rule_assoc = AVar12;
  }
  v = &pPVar7->rules;
  ppRVar4 = (pPVar7->rules).v;
  ppRVar13 = (pPVar7->rules).e;
  if (ppRVar4 == (Rule **)0x0) {
    (pPVar7->rules).v = ppRVar13;
    uVar1 = (pPVar7->rules).n;
    (pPVar7->rules).n = uVar1 + 1;
    (pPVar7->rules).e[uVar1] = pRVar8;
  }
  else {
    uVar1 = v->n;
    if (ppRVar4 == ppRVar13) {
      if (2 < uVar1) goto LAB_0013c36b;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013c36b:
      vec_add_internal(v,pRVar8);
      goto LAB_0013c376;
    }
    v->n = uVar1 + 1;
    ppRVar4[uVar1] = pRVar8;
  }
LAB_0013c376:
  pRVar8 = (Rule *)malloc(0xa8);
  memset(pRVar8,0,0xa8);
  pRVar8->prod = pPVar7;
  pEVar10 = (Elem *)malloc(0x20);
  pEVar10->kind = ELEM_NTERM;
  pEVar10->index = 0;
  pEVar10->rule = (Rule *)0x0;
  (pEVar10->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar10->e + 8) = 0;
  pRVar8->end = pEVar10;
  pEVar10->kind = ELEM_END;
  pEVar10->rule = pRVar8;
  pRVar8->action_index = g->action_index;
  ppEVar5 = (pRVar8->elems).v;
  ppEVar2 = (pRVar8->elems).e;
  if (ppEVar5 == (Elem **)0x0) {
    (pRVar8->elems).v = ppEVar2;
    uVar1 = (pRVar8->elems).n;
    (pRVar8->elems).n = uVar1 + 1;
    (pRVar8->elems).e[uVar1] = pEVar9;
  }
  else {
    paVar14 = &pRVar8->elems;
    uVar1 = paVar14->n;
    if (ppEVar5 == ppEVar2) {
      if (2 < uVar1) goto LAB_0013c41a;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013c41a:
      vec_add_internal(paVar14,pEVar9);
      goto LAB_0013c422;
    }
    paVar14->n = uVar1 + 1;
    ppEVar5[uVar1] = pEVar9;
  }
LAB_0013c422:
  pEVar9->rule = pRVar8;
  ppRVar4 = (pPVar7->rules).v;
  if (ppRVar4 == (Rule **)0x0) {
    (pPVar7->rules).v = ppRVar13;
    uVar1 = (pPVar7->rules).n;
    (pPVar7->rules).n = uVar1 + 1;
    (pPVar7->rules).e[uVar1] = pRVar8;
  }
  else {
    uVar1 = v->n;
    if (ppRVar4 == ppRVar13) {
      if (2 < uVar1) goto LAB_0013c476;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013c476:
      vec_add_internal(v,pRVar8);
      return;
    }
    v->n = uVar1 + 1;
    ppRVar4[uVar1] = pRVar8;
  }
  return;
}

Assistant:

void plus_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;
  Elem *elem;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_PLUS;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    elem = last_elem(g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_LEFT;
    }
  } else {
    elem = last_elem(g->r);
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_RIGHT;
    }
  }
  vec_add(&pp->rules, rr);
  rr = new_rule(g, pp);
  vec_add(&rr->elems, elem);
  elem->rule = rr;
  vec_add(&pp->rules, rr);
}